

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SizeT ARM_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  ulong in_RAX;
  ulong uVar1;
  uint uVar2;
  
  if (3 < size) {
    in_RAX = 0xfffffff8;
    uVar1 = 0;
    do {
      if (data[uVar1 + 3] == 0xeb) {
        uVar2 = (int)in_RAX +
                ((uint)data[uVar1] | (uint)data[uVar1 + 1] << 8 | (uint)data[uVar1 + 2] << 0x10) * 4
        ;
        data[uVar1 + 2] = (Byte)(uVar2 >> 0x12);
        data[uVar1 + 1] = (Byte)(uVar2 >> 10);
        data[uVar1] = (Byte)(uVar2 >> 2);
      }
      uVar1 = uVar1 + 4;
      in_RAX = (ulong)((int)in_RAX - 4);
    } while (uVar1 <= size - 4);
  }
  return in_RAX;
}

Assistant:

static SizeT ARM_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 8;
  for (i = 0; i <= size; i += 4)
  {
    if (data[i + 3] == 0xEB)
    {
      UInt32 dest;
      UInt32 src = ((UInt32)data[i + 2] << 16) | ((UInt32)data[i + 1] << 8) | (data[i + 0]);
      src <<= 2;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 2;
      data[i + 2] = (Byte)(dest >> 16);
      data[i + 1] = (Byte)(dest >> 8);
      data[i + 0] = (Byte)dest;
    }
  }
  return i;
}